

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

string * __thiscall
pbrt::Interval::ToString_abi_cxx11_(string *__return_storage_ptr__,Interval *this)

{
  float *in_R8;
  
  StringPrintf<float_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ Interval [%f, %f] ]",(char *)this,&this->high,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string Interval::ToString() const {
    return StringPrintf("[ Interval [%f, %f] ]", low, high);
}